

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O3

Var Js::Math::Hypot(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  double *pdVar6;
  uint uVar7;
  double dVar8;
  int in_stack_00000010;
  Arguments local_80;
  CallInfo local_70;
  CallInfo callInfo_local;
  ArgumentReader args;
  double local_50;
  double local_48;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_70 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x621,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d34c44;
    *puVar4 = 0;
  }
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_70);
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x622,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00d34c44;
    *puVar4 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_70 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x625,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00d34c44;
    *puVar4 = 0;
  }
  uVar7 = callInfo_local._0_4_ & 0xffffff;
  if (uVar7 == 3) {
    pvVar5 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    if (((ulong)pvVar5 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) goto LAB_00d34a3e;
      if ((ulong)pvVar5 >> 0x32 == 0) {
        local_48 = JavascriptConversion::ToNumber_Full(pvVar5,pSVar1);
      }
      else {
        local_48 = (double)((ulong)pvVar5 ^ 0xfffc000000000000);
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00d34c44;
      *puVar4 = 0;
LAB_00d34a3e:
      local_48 = (double)(int)pvVar5;
    }
    pvVar5 = Arguments::operator[]((Arguments *)&callInfo_local,2);
    if (((ulong)pvVar5 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) goto LAB_00d34ae4;
      if ((ulong)pvVar5 >> 0x32 == 0) {
        local_50 = JavascriptConversion::ToNumber_Full(pvVar5,pSVar1);
      }
      else {
        local_50 = (double)((ulong)pvVar5 ^ 0xfffc000000000000);
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) {
LAB_00d34c44:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
LAB_00d34ae4:
      local_50 = (double)(int)pvVar5;
    }
    bVar3 = NumberUtilities::IsSpecial(local_48,0x7ff0000000000000);
    if ((((bVar3) || (bVar3 = NumberUtilities::IsSpecial(local_48,0xfff0000000000000), bVar3)) ||
        (bVar3 = NumberUtilities::IsSpecial(local_50,0x7ff0000000000000), bVar3)) ||
       (bVar3 = NumberUtilities::IsSpecial(local_50,0xfff0000000000000), bVar3)) goto LAB_00d34b4d;
    bVar3 = NumberUtilities::IsNan(local_48);
    if ((!bVar3) && (bVar3 = NumberUtilities::IsNan(local_50), !bVar3)) {
      dVar8 = hypot(local_48,local_50);
      goto LAB_00d34b58;
    }
LAB_00d34c24:
    pdVar6 = &NumberConstants::NaN;
  }
  else {
    if (uVar7 != 2) {
      dVar8 = 0.0;
      if (3 < uVar7) {
        local_80.Info = callInfo_local;
        local_80.Values = (Type)&stack0x00000018;
        dVar8 = HypotHelper(&local_80,pSVar1);
      }
      goto LAB_00d34b58;
    }
    pvVar5 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    if (((ulong)pvVar5 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) goto LAB_00d349d3;
      if ((ulong)pvVar5 >> 0x32 == 0) {
        dVar8 = JavascriptConversion::ToNumber_Full(pvVar5,pSVar1);
      }
      else {
        dVar8 = (double)((ulong)pvVar5 ^ 0xfffc000000000000);
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00d34c44;
      *puVar4 = 0;
LAB_00d349d3:
      dVar8 = (double)(int)pvVar5;
    }
    bVar3 = NumberUtilities::IsSpecial(dVar8,0x7ff0000000000000);
    if ((!bVar3) && (bVar3 = NumberUtilities::IsSpecial(dVar8,0xfff0000000000000), !bVar3)) {
      bVar3 = NumberUtilities::IsNan(dVar8);
      if (!bVar3) {
        dVar8 = ABS(dVar8);
        goto LAB_00d34b58;
      }
      goto LAB_00d34c24;
    }
LAB_00d34b4d:
    pdVar6 = &NumberConstants::POSITIVE_INFINITY;
  }
  dVar8 = *pdVar6;
LAB_00d34b58:
  pvVar5 = JavascriptNumber::ToVarNoCheck(dVar8,pSVar1);
  return pvVar5;
}

Assistant:

Var Math::Hypot(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Math_Constructor_hypot);

        // ES6 20.2.2.18 Math.hypot(value1, value2, ...values)
        // If no arguments are passed, the result is +0.
        // If any argument is +Infinity, the result is +Infinity.
        // If any argument is -Infinity, the result is +Infinity.
        // If no argument is +Infinity or -Infinity, and any argument is NaN, the result is NaN.
        // If all arguments are either +0 or -0, the result is +0.

        double result = JavascriptNumber::k_Zero; // If there are no arguments return value is positive zero.

        if (args.Info.Count == 2)
        {
            // Special case for one argument
            double x1 = JavascriptConversion::ToNumber(args[1], scriptContext);

            if (JavascriptNumber::IsPosInf(x1) || JavascriptNumber::IsNegInf(x1))
            {
                result = JavascriptNumber::POSITIVE_INFINITY;
            }
            else
            {
                result = Math::Abs(x1);
            }
        }
        else if (args.Info.Count == 3)
        {
            // CRT hypot call
            double x1 = JavascriptConversion::ToNumber(args[1], scriptContext);
            double x2 = JavascriptConversion::ToNumber(args[2], scriptContext);

            if (JavascriptNumber::IsPosInf(x1) || JavascriptNumber::IsNegInf(x1) ||
                JavascriptNumber::IsPosInf(x2) || JavascriptNumber::IsNegInf(x2))
            {
                result = JavascriptNumber::POSITIVE_INFINITY;
            }
            else if (JavascriptNumber::IsNan(x1) || JavascriptNumber::IsNan(x2))
            {
                result = JavascriptNumber::NaN;
            }
            else
            {
                result = ::hypot(x1, x2);
            }
        }
        else if (args.Info.Count > 3)
        {
            // Uncommon case of more than 2 arguments for hypot
            result = Math::HypotHelper(args, scriptContext);
        }

        return JavascriptNumber::ToVarNoCheck(result, scriptContext);
    }